

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cc
# Opt level: O0

string * __thiscall
kratos::full_path_abi_cxx11_(string *__return_storage_ptr__,kratos *this,Var *var)

{
  VarType VVar1;
  element_type *this_00;
  char (*format_str) [4];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str_00;
  format_args args;
  remove_reference_t<long> *local_b8;
  undefined1 local_b0 [24];
  shared_ptr<kratos::Const> *c;
  Var *var_local;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_78;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_long>
  *vargs;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_40;
  string *local_38;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_28;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  c = (shared_ptr<kratos::Const> *)this;
  var_local = (Var *)__return_storage_ptr__;
  VVar1 = Var::type((Var *)this);
  if (VVar1 == ConstValue) {
    Var::as<kratos::Const>((Var *)local_b0);
    local_b0._16_8_ = (Var *)local_b0;
    this_00 = std::__shared_ptr_access<kratos::Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_b0);
    local_b8 = (remove_reference_t<long> *)Const::value(this_00);
    local_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x428a23;
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_long>
             *)&local_b8;
    local_38 = __return_storage_ptr__;
    local_68.named_args.data =
         (named_arg_info<char> *)
         fmt::v7::make_args_checked<long,char[4],char>
                   ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_long>
                     *)0x428a23,(v7 *)vargs,format_str,local_b8);
    local_50 = &local_68;
    local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
                )fmt::v7::to_string_view<char,_0>((char *)local_40._M_pi);
    local_28._M_allocated_capacity = (size_type)&local_88;
    local_30 = local_50;
    local_28._8_8_ = local_50;
    local_10 = local_50;
    local_18 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)local_28._M_allocated_capacity;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args((basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_28._M_allocated_capacity,3,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)&local_50->string);
    format_str_00.size_ = local_88.desc_;
    format_str_00.data_ = (char *)local_78._8_8_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_88.field_1.values_;
    fmt::v7::detail::vformat_abi_cxx11_
              (__return_storage_ptr__,(detail *)local_78._M_allocated_capacity,format_str_00,args);
    std::shared_ptr<kratos::Const>::~shared_ptr((shared_ptr<kratos::Const> *)local_b0);
  }
  else {
    (*(code *)(((c->super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_Var).sinks_._M_h._M_bucket_count)(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string full_path(Var *var) {
    if (var->type() == VarType::ConstValue) {
        auto const &c = var->as<Const>();
        return fmt::format("{0}", c->value());
    } else {
        return var->handle_name();
    }
}